

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall ORPG::Characters::RaceSelector::RaceSelector(RaceSelector *this)

{
  race_node *prVar1;
  race_node *parent;
  race_node *prVar2;
  race_node *parent_00;
  race_node *prVar3;
  RaceSelector *this_00;
  race_node *local_48;
  race_node *local_40;
  race_node *local_38;
  
  this_00 = this;
  prVar1 = allocate_node(this,0x1b800000,false,(race_node *)0x0);
  this->head = prVar1;
  prVar1 = allocate_node(this_00,0x1b800001,true,prVar1);
  parent = allocate_node(this_00,0x1b800010,true,this->head);
  prVar2 = allocate_node(this_00,0x1b800011,true,parent);
  parent_00 = allocate_node(this_00,0x1b800020,true,this->head);
  prVar3 = allocate_node(this_00,0x1b800021,true,parent_00);
  local_48 = prVar2;
  std::
  vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
  ::_M_assign_aux<ORPG::Characters::RaceSelector::race_node*const*>
            ((vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
              *)&parent->children,&local_48);
  local_48 = prVar3;
  std::
  vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
  ::_M_assign_aux<ORPG::Characters::RaceSelector::race_node*const*>
            ((vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
              *)&parent_00->children,&local_48,&local_40);
  local_48 = prVar1;
  local_40 = parent;
  local_38 = parent_00;
  std::
  vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
  ::_M_assign_aux<ORPG::Characters::RaceSelector::race_node*const*>
            ((vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
              *)&this->head->children,&local_48,&stack0xffffffffffffffd0);
  this->current = this->head;
  return;
}

Assistant:

RaceSelector::RaceSelector() {
            head = allocate_node(Race::ID, false, NULL);

            auto human = allocate_node(Human::ID, true, head);

            auto dwarf = allocate_node(Dwarf::ID, true, head);
            auto hillDwarf = allocate_node(HillDwarf::ID, true, dwarf);

            auto elf = allocate_node(Elf::ID, true, head);
            auto highElf = allocate_node(HighElf::ID, true, elf);

            dwarf->children = {
                hillDwarf
            };

            elf->children = {
                highElf
            };

            head->children = {
                human,
                dwarf,
                elf
            };

            current = head;
        }